

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIO.cpp
# Opt level: O1

void __thiscall Imf_3_2::IStream::~IStream(IStream *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_IStream = (_func_int **)&PTR__IStream_003d7a20;
  pcVar1 = (this->_fileName)._M_dataplus._M_p;
  paVar2 = &(this->_fileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

IStream::~IStream ()
{
    // empty
}